

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.test.cpp
# Opt level: O2

void __thiscall npas4_AllocAll_Test::TestBody(npas4_AllocAll_Test *this)

{
  long lVar1;
  double unaff_RBX;
  char *message;
  double unaff_R14;
  AssertHelper in_stack_ffffffffffffffc8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffd0;
  AssertionResult gtest_ar;
  
  npas4::GetRAMSystemUsedByCurrentProcess();
  npas4::GetRAMVirtualUsedByCurrentProcess();
  lVar1 = std::chrono::_V2::system_clock::now();
  if (lVar1 == 0) {
    npas4::GetRAMSystemUsedByCurrentProcess();
    npas4::GetRAMVirtualUsedByCurrentProcess();
    testing::internal::DoubleNearPredFormat
              ((char *)in_stack_ffffffffffffffd0.ptr_,(char *)in_stack_ffffffffffffffc8.data_,
               (char *)0x11f8aa,unaff_R14,unaff_RBX,(double)gtest_ar.message_.ptr_);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&stack0xffffffffffffffd0);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffc8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
                 ,0x89,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffc8,(Message *)&stack0xffffffffffffffd0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffffd0);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  return;
}

Assistant:

TEST(npas4, AllocAll)
{
	const auto startCurrentProcess = npas4::GetRAMSystemUsedByCurrentProcess() + npas4::GetRAMVirtualUsedByCurrentProcess();

	// This will always be true, but the compiler won't know that, preventing the
	// allocation from happening before we want it to.
	if(std::chrono::system_clock::now() == std::chrono::time_point<std::chrono::system_clock>())
	{
		const int64_t allocAmmount = 1052672;
		volatile uint8_t* megabyte = new uint8_t[allocAmmount];

		// Assume we are not swapping out to disk
		auto memoryDelta = npas4::GetRAMSystemUsedByCurrentProcess()  + npas4::GetRAMVirtualUsedByCurrentProcess() - startCurrentProcess;
		EXPECT_NEAR(allocAmmount, memoryDelta, 4096);
		delete[] megabyte;
	}
}